

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_tls.c
# Opt level: O0

int mbedtls_ssl_flush_output(mbedtls_ssl_context *ssl)

{
  uchar *puVar1;
  uchar uVar2;
  int ret_00;
  size_t sVar3;
  byte local_29;
  uchar i;
  uchar *buf;
  int ret;
  mbedtls_ssl_context *ssl_local;
  
  mbedtls_debug_print_msg
            (ssl,2,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_tls.c"
             ,0x970,"=> flush output");
  if (ssl->f_send == (mbedtls_ssl_send_t *)0x0) {
    mbedtls_debug_print_msg
              (ssl,1,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_tls.c"
               ,0x975,"Bad usage of mbedtls_ssl_set_bio() or mbedtls_ssl_set_bio()");
    ssl_local._4_4_ = -0x7100;
  }
  else if (ssl->out_left == 0) {
    mbedtls_debug_print_msg
              (ssl,2,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_tls.c"
               ,0x97c,"<= flush output");
    ssl_local._4_4_ = 0;
  }
  else {
    while (ssl->out_left != 0) {
      sVar3 = mbedtls_ssl_hdr_len(ssl);
      mbedtls_debug_print_msg
                (ssl,2,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_tls.c"
                 ,0x983,"message length: %d, out_left: %d",sVar3 + ssl->out_msglen,ssl->out_left);
      puVar1 = ssl->out_hdr;
      sVar3 = mbedtls_ssl_hdr_len(ssl);
      ret_00 = (*ssl->f_send)(ssl->p_bio,puVar1 + ((ssl->out_msglen + sVar3) - ssl->out_left),
                              ssl->out_left);
      mbedtls_debug_print_ret
                (ssl,2,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_tls.c"
                 ,0x989,"ssl->f_send",ret_00);
      if (ret_00 < 1) {
        return ret_00;
      }
      ssl->out_left = ssl->out_left - (long)ret_00;
    }
    local_29 = 8;
    while ((sVar3 = ssl_ep_len(ssl), sVar3 < local_29 &&
           (uVar2 = ssl->out_ctr[(int)(local_29 - 1)] + '\x01',
           ssl->out_ctr[(int)(local_29 - 1)] = uVar2, uVar2 == '\0'))) {
      local_29 = local_29 - 1;
    }
    sVar3 = ssl_ep_len(ssl);
    if (local_29 == sVar3) {
      mbedtls_debug_print_msg
                (ssl,1,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_tls.c"
                 ,0x998,"outgoing message counter would wrap");
      ssl_local._4_4_ = -0x6b80;
    }
    else {
      mbedtls_debug_print_msg
                (ssl,2,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_tls.c"
                 ,0x99c,"<= flush output");
      ssl_local._4_4_ = 0;
    }
  }
  return ssl_local._4_4_;
}

Assistant:

int mbedtls_ssl_flush_output( mbedtls_ssl_context *ssl )
{
    int ret;
    unsigned char *buf, i;

    MBEDTLS_SSL_DEBUG_MSG( 2, ( "=> flush output" ) );

    if( ssl->f_send == NULL )
    {
        MBEDTLS_SSL_DEBUG_MSG( 1, ( "Bad usage of mbedtls_ssl_set_bio() "
                            "or mbedtls_ssl_set_bio()" ) );
        return( MBEDTLS_ERR_SSL_BAD_INPUT_DATA );
    }

    /* Avoid incrementing counter if data is flushed */
    if( ssl->out_left == 0 )
    {
        MBEDTLS_SSL_DEBUG_MSG( 2, ( "<= flush output" ) );
        return( 0 );
    }

    while( ssl->out_left > 0 )
    {
        MBEDTLS_SSL_DEBUG_MSG( 2, ( "message length: %d, out_left: %d",
                       mbedtls_ssl_hdr_len( ssl ) + ssl->out_msglen, ssl->out_left ) );

        buf = ssl->out_hdr + mbedtls_ssl_hdr_len( ssl ) +
              ssl->out_msglen - ssl->out_left;
        ret = ssl->f_send( ssl->p_bio, buf, ssl->out_left );

        MBEDTLS_SSL_DEBUG_RET( 2, "ssl->f_send", ret );

        if( ret <= 0 )
            return( ret );

        ssl->out_left -= ret;
    }

    for( i = 8; i > ssl_ep_len( ssl ); i-- )
        if( ++ssl->out_ctr[i - 1] != 0 )
            break;

    /* The loop goes to its end iff the counter is wrapping */
    if( i == ssl_ep_len( ssl ) )
    {
        MBEDTLS_SSL_DEBUG_MSG( 1, ( "outgoing message counter would wrap" ) );
        return( MBEDTLS_ERR_SSL_COUNTER_WRAPPING );
    }

    MBEDTLS_SSL_DEBUG_MSG( 2, ( "<= flush output" ) );

    return( 0 );
}